

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.h
# Opt level: O2

void __thiscall
FactoredMMDPDiscrete::FactoredMMDPDiscrete
          (FactoredMMDPDiscrete *this,void **vtt,string *name,string *descr,string *pf)

{
  void *pvVar1;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  std::__cxx11::string::string((string *)&local_60,(string *)descr);
  std::__cxx11::string::string((string *)&local_80,(string *)pf);
  FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
            (&this->super_FactoredDecPOMDPDiscrete,vtt + 1,&local_40,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pvVar1 = *vtt;
  *(void **)&(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x58)) = vtt[0x14];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x15];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0x16];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0x17];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x18];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x19];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x1a];
  *(void **)&(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = vtt[0x1b];
  return;
}

Assistant:

FactoredMMDPDiscrete(
    std::string name="received unspec. by FactoredMMDPDiscrete", 
    std::string descr="received unspec. by FactoredMMDPDiscrete", 
    std::string pf="received unspec. by FactoredMMDPDiscrete")
        : FactoredDecPOMDPDiscrete(name, descr, pf)
    {
        //SetFlatObservationModel(new ObservationModelIdentityMapping());
        
        //MADPComponentDiscreteObservations::SetInitialized(true) can
        //overflow _m_nrJointObservations (indicated by _m_jointIndicesValid).
        //(likely)

        //Problem occurs if single observation variable's stepsize
        //calculations already overflow (happens in 2DBN::InitializeIIs()).
        //(unlikely)
    }